

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O1

int parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  FILE *__stream;
  byte *pbVar8;
  int iVar9;
  uint uVar10;
  byte bVar11;
  byte *pbVar12;
  bool bVar13;
  dynbuf buf;
  dynbuf local_50;
  
  pcVar1 = *loginp;
  pcVar2 = *passwordp;
  __stream = fopen64(netrcfile,"r");
  if (__stream == (FILE *)0x0) {
    return 1;
  }
  Curl_dyn_init(&local_50,0x1000);
  uVar10 = 0;
  bVar5 = false;
  iVar7 = 1;
LAB_00148741:
  if ((!bVar5) && (iVar6 = Curl_get_line(&local_50,(FILE *)__stream), iVar6 != 0)) {
    pbVar8 = (byte *)Curl_dyn_ptr(&local_50);
    if (uVar10 == 3) {
      uVar10 = 0;
      if ((*pbVar8 == 0xd) || (*pbVar8 == 10)) goto LAB_00148773;
      uVar10 = 3;
    }
    else {
LAB_00148773:
      if (pbVar8 != (byte *)0x0) {
        do {
          bVar11 = *pbVar8;
          if (bVar11 < 0x20) {
            if (bVar11 != 9) {
              if (bVar11 != 0) goto LAB_001487bb;
              goto LAB_00148adf;
            }
          }
          else if (bVar11 != 0x20) goto LAB_00148798;
          pbVar8 = pbVar8 + 1;
        } while( true );
      }
    }
    bVar13 = false;
    goto LAB_00148b08;
  }
  goto LAB_00148b66;
LAB_00148798:
  if (bVar11 == 0x22) {
    bVar13 = false;
    bVar4 = false;
    pbVar12 = pbVar8;
    do {
      pbVar12 = pbVar12 + 1;
      bVar11 = *pbVar12;
      if (bVar11 == 0) break;
      if (bVar13) {
        if (bVar11 == 0x74) {
          bVar11 = 9;
        }
        else if (bVar11 == 0x72) {
          bVar11 = 0xd;
        }
        else if (bVar11 == 0x6e) {
          bVar11 = 10;
        }
        bVar13 = false;
LAB_00148829:
        *pbVar8 = bVar11;
        pbVar8 = pbVar8 + 1;
LAB_0014882f:
        bVar3 = false;
      }
      else {
        if (bVar11 == 0x5c) {
          bVar13 = true;
          goto LAB_0014882f;
        }
        if (bVar11 != 0x22) goto LAB_00148829;
        bVar3 = true;
        bVar4 = true;
      }
    } while (!bVar3);
    *pbVar8 = 0;
    iVar9 = 0xf;
    iVar6 = -1;
    if (bVar13) {
      bVar13 = false;
    }
    else {
      bVar13 = false;
      if (bVar4) {
        bVar13 = true;
        iVar9 = 0;
        iVar6 = iVar7;
      }
    }
    iVar7 = iVar6;
    if (bVar13) goto LAB_00148865;
  }
  else {
    if (bVar11 == 0x23) {
LAB_00148adf:
      bVar13 = false;
      goto LAB_00148b08;
    }
LAB_001487bb:
    for (; ((bVar11 = *pbVar8, bVar11 != 9 && (bVar11 != 0x20)) && ((byte)(bVar11 - 0xe) < 0xfc));
        pbVar8 = pbVar8 + 1) {
    }
    *pbVar8 = 0;
LAB_00148865:
    if (((pcVar1 == (char *)0x0) || (pcVar2 == (char *)0x0 || *pcVar1 == '\0')) || (*pcVar2 == '\0')
       ) {
      iVar7 = (*(code *)((long)&DAT_00178adc + (long)(int)(&DAT_00178adc)[uVar10]))();
      return iVar7;
    }
    iVar9 = 0;
    bVar5 = true;
  }
  bVar13 = iVar9 == 0xf;
LAB_00148b08:
  if (bVar13) {
LAB_00148b66:
    Curl_dyn_free(&local_50);
    fclose(__stream);
    return iVar7;
  }
  goto LAB_00148741;
}

Assistant:

static int parsenetrc(const char *host,
                      char **loginp,
                      char **passwordp,
                      char *netrcfile)
{
  FILE *file;
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = TRUE;  /* With specific_login, found *our* login
                                  name (or login-less line) */

  DEBUGASSERT(netrcfile);

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(file) {
    bool done = FALSE;
    struct dynbuf buf;
    Curl_dyn_init(&buf, MAX_NETRC_LINE);

    while(!done && Curl_get_line(&buf, file)) {
      char *tok;
      char *tok_end;
      bool quoted;
      char *netrcbuffer = Curl_dyn_ptr(&buf);
      if(state == MACDEF) {
        if((netrcbuffer[0] == '\n') || (netrcbuffer[0] == '\r'))
          state = NOTHING;
        else
          continue;
      }
      tok = netrcbuffer;
      while(tok) {
        while(ISBLANK(*tok))
          tok++;
        /* tok is first non-space letter */
        if(!*tok || (*tok == '#'))
          /* end of line or the rest is a comment */
          break;

        /* leading double-quote means quoted string */
        quoted = (*tok == '\"');

        tok_end = tok;
        if(!quoted) {
          while(!ISSPACE(*tok_end))
            tok_end++;
          *tok_end = 0;
        }
        else {
          bool escape = FALSE;
          bool endquote = FALSE;
          char *store = tok;
          tok_end++; /* pass the leading quote */
          while(*tok_end) {
            char s = *tok_end;
            if(escape) {
              escape = FALSE;
              switch(s) {
              case 'n':
                s = '\n';
                break;
              case 'r':
                s = '\r';
                break;
              case 't':
                s = '\t';
                break;
              }
            }
            else if(s == '\\') {
              escape = TRUE;
              tok_end++;
              continue;
            }
            else if(s == '\"') {
              tok_end++; /* pass the ending quote */
              endquote = TRUE;
              break;
            }
            *store++ = s;
            tok_end++;
          }
          *store = 0;
          if(escape || !endquote) {
            /* bad syntax, get out */
            retcode = NETRC_FAILED;
            goto out;
          }
        }

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("macdef", tok)) {
            /* Define a macro. A macro is defined with the specified name; its
               contents begin with the next .netrc line and continue until a
               null line (consecutive new-line characters) is encountered. */
            state = MACDEF;
          }
          else if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          break;
        case MACDEF:
          if(!strlen(tok)) {
            state = NOTHING;
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = !Curl_timestrcmp(login, tok);
            }
            else if(!login || Curl_timestrcmp(login, tok)) {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if((state_our_login || !specific_login)
               && (!password || Curl_timestrcmp(password, tok))) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there is machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */
        tok = ++tok_end;
      }
    } /* while Curl_get_line() */

out:
    Curl_dyn_free(&buf);
    if(!retcode) {
      /* success */
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}